

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> * __thiscall
spirv_cross::CompilerGLSL::get_composite_constant_ids
          (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *__return_storage_ptr__,
          CompilerGLSL *this,ConstantID const_id)

{
  bool bVar1;
  SPIRConstant *pSVar2;
  SPIRType *type;
  size_type sVar3;
  mapped_type *other;
  CompilerError *pCVar4;
  ID *init;
  allocator local_49;
  string local_48;
  
  pSVar2 = Compiler::maybe_get<spirv_cross::SPIRConstant>(&this->super_Compiler,const_id.id);
  if (pSVar2 == (SPIRConstant *)0x0) {
    local_48._M_dataplus._M_p._0_4_ = const_id.id;
    sVar3 = ::std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count(&(this->const_composite_insert_ids)._M_h,(key_type *)&local_48);
    if (sVar3 == 0) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_48,"Unimplemented for this OpSpecConstantOp!",&local_49);
      CompilerError::CompilerError(pCVar4,&local_48);
      __cxa_throw(pCVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_48._M_dataplus._M_p._0_4_ = const_id.id;
    other = ::std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->const_composite_insert_ids,(key_type *)&local_48);
  }
  else {
    type = Compiler::get<spirv_cross::SPIRType>
                     (&this->super_Compiler,*(uint32_t *)&(pSVar2->super_IVariant).field_0xc);
    bVar1 = Compiler::is_array(&this->super_Compiler,type);
    if ((!bVar1) && (*(int *)&(type->super_IVariant).field_0xc != 0xf)) {
      bVar1 = Compiler::is_matrix(&this->super_Compiler,type);
      if (bVar1) {
        init = (pSVar2->m).id;
      }
      else {
        bVar1 = Compiler::is_vector(&this->super_Compiler,type);
        if (!bVar1) {
          pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_48,"Unexpected scalar constant!",&local_49);
          CompilerError::CompilerError(pCVar4,&local_48);
          __cxa_throw(pCVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        init = (pSVar2->m).c[0].id;
      }
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,8ul>::
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,4ul>
                (__return_storage_ptr__,(TypedID<(spirv_cross::Types)0> (*) [4])init);
      return __return_storage_ptr__;
    }
    other = &pSVar2->subconstants;
  }
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>::SmallVector
            (__return_storage_ptr__,other);
  return __return_storage_ptr__;
}

Assistant:

SmallVector<ConstantID> CompilerGLSL::get_composite_constant_ids(ConstantID const_id)
{
	if (auto *constant = maybe_get<SPIRConstant>(const_id))
	{
		const auto &type = get<SPIRType>(constant->constant_type);
		if (is_array(type) || type.basetype == SPIRType::Struct)
			return constant->subconstants;
		if (is_matrix(type))
			return SmallVector<ConstantID>(constant->m.id);
		if (is_vector(type))
			return SmallVector<ConstantID>(constant->m.c[0].id);
		SPIRV_CROSS_THROW("Unexpected scalar constant!");
	}
	if (!const_composite_insert_ids.count(const_id))
		SPIRV_CROSS_THROW("Unimplemented for this OpSpecConstantOp!");
	return const_composite_insert_ids[const_id];
}